

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  long end;
  Index index;
  long index_00;
  long start;
  
  end = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage
        .m_rows;
  start = (end / 4) * 4;
  for (index_00 = 0; index_00 < start; index_00 = index_00 + 4) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,-1,1,0,-1,1>>,Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>const>>,Eigen::internal::assign_op<float,float>,0>
    ::assignPacket<16,16,float__vector(4)>
              ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>>,Eigen::internal::assign_op<float,float>,0>
                *)kernel,index_00);
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,1,0,_1,1>>,Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>>,Eigen::internal::assign_op<float,float>,0>>
            (kernel,start,end);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }